

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void pcache1EnforceMaxPage(PCache1 *pCache)

{
  uint *puVar1;
  PGroup *pPVar2;
  PgHdr1 *pPage;
  PgHdr1 *pPVar3;
  PgHdr1 *pPVar4;
  
  pPVar2 = pCache->pGroup;
  while ((pPVar2->nMaxPage < pPVar2->nPurgeable &&
         (pPage = (pPVar2->lru).pLruPrev, pPage->isAnchor == '\0'))) {
    pPVar3 = pPage->pLruNext;
    pPVar4 = pPage->pLruPrev;
    pPVar4->pLruNext = pPVar3;
    pPVar3->pLruPrev = pPVar4;
    pPage->pLruNext = (PgHdr1 *)0x0;
    pPage->pLruPrev = (PgHdr1 *)0x0;
    puVar1 = &pPage->pCache->nRecyclable;
    *puVar1 = *puVar1 - 1;
    pcache1RemoveFromHash(pPage,1);
  }
  if ((pCache->nPage == 0) && (pCache->pBulk != (void *)0x0)) {
    sqlite3_free(pCache->pBulk);
    pCache->pFree = (PgHdr1 *)0x0;
    pCache->pBulk = (void *)0x0;
  }
  return;
}

Assistant:

static void pcache1EnforceMaxPage(PCache1 *pCache){
  PGroup *pGroup = pCache->pGroup;
  PgHdr1 *p;
  assert( sqlite3_mutex_held(pGroup->mutex) );
  while( pGroup->nPurgeable>pGroup->nMaxPage
      && (p=pGroup->lru.pLruPrev)->isAnchor==0
  ){
    assert( p->pCache->pGroup==pGroup );
    assert( PAGE_IS_UNPINNED(p) );
    pcache1PinPage(p);
    pcache1RemoveFromHash(p, 1);
  }
  if( pCache->nPage==0 && pCache->pBulk ){
    sqlite3_free(pCache->pBulk);
    pCache->pBulk = pCache->pFree = 0;
  }
}